

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

char * ucnv_detectUnicodeSignature_63
                 (char *source,int32_t sourceLength,int32_t *signatureLength,UErrorCode *pErrorCode)

{
  undefined8 in_RAX;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  undefined1 local_18 [2];
  char cStack_16;
  byte bStack_15;
  char local_14;
  undefined3 uStack_13;
  
  _local_18 = CONCAT35((int3)((ulong)in_RAX >> 0x28),0xa500000000);
  _local_18 = CONCAT44(_local_14,0xa5a5a5a5);
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (source != (char *)0x0 && -2 < sourceLength) {
      if (sourceLength == -1) {
        sVar1 = strlen(source);
        sourceLength = (int32_t)sVar1;
      }
      for (uVar3 = 0; ((long)uVar3 < (long)sourceLength && (uVar3 < 5)); uVar3 = uVar3 + 1) {
        local_18[uVar3] = source[uVar3];
      }
      if (local_18[1] == 0xff && local_18[0] == -2) {
        pcVar2 = "UTF-16BE";
      }
      else {
        if (local_18[0] != -1 || (local_18[1] ^ 0xfe) != 0) {
          if (cStack_16 == -0x41 && (local_18[1] == 0xbb && local_18[0] == -0x11)) {
            pcVar2 = "UTF-8";
          }
          else {
            if (bStack_15 == 0xff && (cStack_16 == -2 && (local_18[0] == '\0' && local_18[1] == 0)))
            {
              pcVar2 = "UTF-32BE";
              goto LAB_003166dc;
            }
            if (cStack_16 == -1 && (local_18[0] == '\x0e' && (local_18[1] ^ 0xfe) == 0)) {
              pcVar2 = "SCSU";
            }
            else {
              if (cStack_16 != '(' || (local_18[1] != 0xee || local_18[0] != -5)) {
                if (cStack_16 == 'v' && (local_18[1] == 0x2f && local_18[0] == '+')) {
                  if ((bStack_15 == 0x38) && (local_14 == '-')) {
                    if (signatureLength != (int32_t *)0x0) {
                      *signatureLength = 5;
                      return "UTF-7";
                    }
                    return "UTF-7";
                  }
                  if ((0x39 < bStack_15) ||
                     ((0x300880000000000U >> ((ulong)bStack_15 & 0x3f) & 1) == 0)) {
LAB_003167be:
                    if (signatureLength == (int32_t *)0x0) {
                      return (char *)0x0;
                    }
                    *signatureLength = 0;
                    return (char *)0x0;
                  }
                  pcVar2 = "UTF-7";
                }
                else {
                  if (bStack_15 != 0x73 ||
                      (cStack_16 != 'f' || (local_18[1] != 0x73 || local_18[0] != -0x23)))
                  goto LAB_003167be;
                  pcVar2 = "UTF-EBCDIC";
                }
LAB_003166dc:
                if (signatureLength != (int32_t *)0x0) {
                  *signatureLength = 4;
                  return pcVar2;
                }
                return pcVar2;
              }
              pcVar2 = "BOCU-1";
            }
          }
          if (signatureLength != (int32_t *)0x0) {
            *signatureLength = 3;
            return pcVar2;
          }
          return pcVar2;
        }
        if (bStack_15 == 0 && cStack_16 == '\0') {
          pcVar2 = "UTF-32LE";
          goto LAB_003166dc;
        }
        pcVar2 = "UTF-16LE";
      }
      if (signatureLength != (int32_t *)0x0) {
        *signatureLength = 2;
        return pcVar2;
      }
      return pcVar2;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_detectUnicodeSignature( const char* source,
                             int32_t sourceLength,
                             int32_t* signatureLength,
                             UErrorCode* pErrorCode) {
    int32_t dummy;

    /* initial 0xa5 bytes: make sure that if we read <SIG_MAX_LEN
     * bytes we don't misdetect something 
     */
    char start[SIG_MAX_LEN]={ '\xa5', '\xa5', '\xa5', '\xa5', '\xa5' };
    int i = 0;

    if((pErrorCode==NULL) || U_FAILURE(*pErrorCode)){
        return NULL;
    }
    
    if(source == NULL || sourceLength < -1){
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(signatureLength == NULL) {
        signatureLength = &dummy;
    }

    if(sourceLength==-1){
        sourceLength=(int32_t)uprv_strlen(source);
    }

    
    while(i<sourceLength&& i<SIG_MAX_LEN){
        start[i]=source[i];
        i++;
    }

    if(start[0] == '\xFE' && start[1] == '\xFF') {
        *signatureLength=2;
        return  "UTF-16BE";
    } else if(start[0] == '\xFF' && start[1] == '\xFE') {
        if(start[2] == '\x00' && start[3] =='\x00') {
            *signatureLength=4;
            return "UTF-32LE";
        } else {
            *signatureLength=2;
            return  "UTF-16LE";
        }
    } else if(start[0] == '\xEF' && start[1] == '\xBB' && start[2] == '\xBF') {
        *signatureLength=3;
        return  "UTF-8";
    } else if(start[0] == '\x00' && start[1] == '\x00' && 
              start[2] == '\xFE' && start[3]=='\xFF') {
        *signatureLength=4;
        return  "UTF-32BE";
    } else if(start[0] == '\x0E' && start[1] == '\xFE' && start[2] == '\xFF') {
        *signatureLength=3;
        return "SCSU";
    } else if(start[0] == '\xFB' && start[1] == '\xEE' && start[2] == '\x28') {
        *signatureLength=3;
        return "BOCU-1";
    } else if(start[0] == '\x2B' && start[1] == '\x2F' && start[2] == '\x76') {
        /*
         * UTF-7: Initial U+FEFF is encoded as +/v8  or  +/v9  or  +/v+  or  +/v/
         * depending on the second UTF-16 code unit.
         * Detect the entire, closed Unicode mode sequence +/v8- for only U+FEFF
         * if it occurs.
         *
         * So far we have +/v
         */
        if(start[3] == '\x38' && start[4] == '\x2D') {
            /* 5 bytes +/v8- */
            *signatureLength=5;
            return "UTF-7";
        } else if(start[3] == '\x38' || start[3] == '\x39' || start[3] == '\x2B' || start[3] == '\x2F') {
            /* 4 bytes +/v8  or  +/v9  or  +/v+  or  +/v/ */
            *signatureLength=4;
            return "UTF-7";
        }
    }else if(start[0]=='\xDD' && start[1]== '\x73'&& start[2]=='\x66' && start[3]=='\x73'){
        *signatureLength=4;
        return "UTF-EBCDIC";
    }


    /* no known Unicode signature byte sequence recognized */
    *signatureLength=0;
    return NULL;
}